

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O3

void __thiscall HeadersSyncState::Finalize(HeadersSyncState *this)

{
  uint256 *puVar1;
  base_blob<256U> *pbVar2;
  _Elt_pointer pCVar3;
  _Elt_pointer pCVar4;
  _Elt_pointer pCVar5;
  _Map_pointer ppCVar6;
  _Elt_pointer pCVar7;
  _Elt_pointer pCVar8;
  _Elt_pointer pCVar9;
  _Map_pointer ppCVar10;
  long lVar11;
  bitdeque<32768> *pbVar12;
  deque<CompressedHeader,_std::allocator<CompressedHeader>_> *pdVar13;
  _Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_> *p_Var14;
  long in_FS_OFFSET;
  byte bVar15;
  _Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_> local_98;
  undefined8 local_48;
  _Map_pointer local_38;
  size_t sStack_30;
  long local_20;
  
  bVar15 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_98._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>::_M_initialize_map
            ((_Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_> *)&local_98,
             0);
  ppCVar10 = local_98._M_impl.super__Deque_impl_data._M_finish._M_node;
  pCVar9 = local_98._M_impl.super__Deque_impl_data._M_finish._M_last;
  pCVar8 = local_98._M_impl.super__Deque_impl_data._M_finish._M_first;
  pCVar7 = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppCVar6 = local_98._M_impl.super__Deque_impl_data._M_start._M_node;
  pCVar5 = local_98._M_impl.super__Deque_impl_data._M_start._M_last;
  pCVar4 = local_98._M_impl.super__Deque_impl_data._M_start._M_first;
  pCVar3 = local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_38 = local_98._M_impl.super__Deque_impl_data._M_map;
  sStack_30 = local_98._M_impl.super__Deque_impl_data._M_map_size;
  pbVar12 = &this->m_header_commitments;
  p_Var14 = &local_98;
  for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
    *(_Map_pointer *)p_Var14 =
         (pbVar12->m_deque).
         super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
         super__Deque_impl_data._M_map;
    pbVar12 = (bitdeque<32768> *)((long)pbVar12 + (ulong)bVar15 * -0x10 + 8);
    p_Var14 = (_Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_> *)
              ((long)p_Var14 + ((ulong)bVar15 * -2 + 1) * 8);
  }
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)local_38;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = sStack_30;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)pCVar3;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)pCVar4;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)pCVar5;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)ppCVar6;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)pCVar7;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)pCVar8;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)pCVar9;
  (this->m_header_commitments).m_deque.
  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)ppCVar10;
  local_48._0_4_ = (this->m_header_commitments).m_pad_begin;
  local_48._4_4_ = (this->m_header_commitments).m_pad_end;
  (this->m_header_commitments).m_pad_begin = 0;
  (this->m_header_commitments).m_pad_end = 0;
  std::_Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>::~_Deque_base
            ((_Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_> *)&local_98)
  ;
  *(undefined8 *)
   ((this->m_last_header_received).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
  (this->m_last_header_received).nBits = 0;
  (this->m_last_header_received).nNonce = 0;
  pbVar2 = &(this->m_last_header_received).hashMerkleRoot.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  pbVar2 = &(this->m_last_header_received).hashMerkleRoot.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)
   ((this->m_last_header_received).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
  pbVar2 = &(this->m_last_header_received).hashMerkleRoot.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[4] = '\0';
  (pbVar2->m_data)._M_elems[5] = '\0';
  (pbVar2->m_data)._M_elems[6] = '\0';
  (pbVar2->m_data)._M_elems[7] = '\0';
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  pbVar2 = &(this->m_last_header_received).hashPrevBlock.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  pbVar2 = &(this->m_last_header_received).hashPrevBlock.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  (this->m_last_header_received).nVersion = 0;
  (this->m_last_header_received).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  (this->m_last_header_received).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  (this->m_last_header_received).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  (this->m_last_header_received).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pbVar2 = &(this->m_last_header_received).hashPrevBlock.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[4] = '\0';
  (pbVar2->m_data)._M_elems[5] = '\0';
  (pbVar2->m_data)._M_elems[6] = '\0';
  (pbVar2->m_data)._M_elems[7] = '\0';
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  local_98._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>::_M_initialize_map
            (&local_98,0);
  ppCVar10 = local_98._M_impl.super__Deque_impl_data._M_finish._M_node;
  pCVar9 = local_98._M_impl.super__Deque_impl_data._M_finish._M_last;
  pCVar8 = local_98._M_impl.super__Deque_impl_data._M_finish._M_first;
  pCVar7 = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppCVar6 = local_98._M_impl.super__Deque_impl_data._M_start._M_node;
  pCVar5 = local_98._M_impl.super__Deque_impl_data._M_start._M_last;
  pCVar4 = local_98._M_impl.super__Deque_impl_data._M_start._M_first;
  pCVar3 = local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_38 = local_98._M_impl.super__Deque_impl_data._M_map;
  sStack_30 = local_98._M_impl.super__Deque_impl_data._M_map_size;
  pdVar13 = &this->m_redownloaded_headers;
  p_Var14 = &local_98;
  for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
    *(_Map_pointer *)p_Var14 =
         (pdVar13->super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>)._M_impl.
         super__Deque_impl_data._M_map;
    pdVar13 = (deque<CompressedHeader,_std::allocator<CompressedHeader>_> *)
              ((long)pdVar13 + (ulong)bVar15 * -0x10 + 8);
    p_Var14 = (_Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_> *)
              ((long)p_Var14 + ((ulong)bVar15 * -2 + 1) * 8);
  }
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_map = local_38;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_map_size = sStack_30;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = pCVar3;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = pCVar4;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = pCVar5;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = ppCVar6;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = pCVar7;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = pCVar8;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = pCVar9;
  (this->m_redownloaded_headers).
  super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = ppCVar10;
  std::_Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>::~_Deque_base(&local_98);
  this->m_process_all_remaining_headers = false;
  this->m_current_height = 0;
  puVar1 = &this->m_redownload_buffer_last_hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar2 = &(this->m_redownload_buffer_last_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  pbVar2 = &(this->m_redownload_buffer_last_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  pbVar2 = &(this->m_redownload_buffer_last_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  (pbVar2->m_data)._M_elems[0x1c] = '\0';
  (pbVar2->m_data)._M_elems[0x1d] = '\0';
  (pbVar2->m_data)._M_elems[0x1e] = '\0';
  (pbVar2->m_data)._M_elems[0x1f] = '\0';
  puVar1 = &this->m_redownload_buffer_first_prev_hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar2 = &(this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  pbVar2 = &(this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  pbVar2 = &(this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  (pbVar2->m_data)._M_elems[0x1c] = '\0';
  (pbVar2->m_data)._M_elems[0x1d] = '\0';
  (pbVar2->m_data)._M_elems[0x1e] = '\0';
  (pbVar2->m_data)._M_elems[0x1f] = '\0';
  this->m_download_state = FINAL;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void HeadersSyncState::Finalize()
{
    Assume(m_download_state != State::FINAL);
    ClearShrink(m_header_commitments);
    m_last_header_received.SetNull();
    ClearShrink(m_redownloaded_headers);
    m_redownload_buffer_last_hash.SetNull();
    m_redownload_buffer_first_prev_hash.SetNull();
    m_process_all_remaining_headers = false;
    m_current_height = 0;

    m_download_state = State::FINAL;
}